

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::getQuaternaries(uint32_t variableTop,uint32_t pair)

{
  undefined4 local_10;
  uint32_t ce;
  uint32_t pair_local;
  uint32_t variableTop_local;
  
  if (pair < 0x10000) {
    if (pair < 0x1000) {
      if (variableTop < pair) {
        local_10 = 0xfc00;
      }
      else {
        local_10 = pair;
        if (0xbff < pair) {
          local_10 = pair & 0xfff8;
        }
      }
    }
    else if ((pair & 0x3e0) < 0x180) {
      local_10 = 0xfc00;
    }
    else {
      local_10 = 0xfc00fc00;
    }
  }
  else if (variableTop < (pair & 0xffff)) {
    local_10 = 0xfc00fc00;
  }
  else {
    local_10 = pair & 0xfff8fff8;
  }
  return local_10;
}

Assistant:

uint32_t
CollationFastLatin::getQuaternaries(uint32_t variableTop, uint32_t pair) {
    // Return the primary weight of a variable CE,
    // or the maximum primary weight for a non-variable, not-completely-ignorable CE.
    if(pair <= 0xffff) {
        // one mini CE
        if(pair >= MIN_SHORT) {
            // A high secondary weight means we really have two CEs,
            // a primary CE and a secondary CE.
            if((pair & SECONDARY_MASK) >= MIN_SEC_HIGH) {
                pair = TWO_SHORT_PRIMARIES_MASK;
            } else {
                pair = SHORT_PRIMARY_MASK;
            }
        } else if(pair > variableTop) {
            pair = SHORT_PRIMARY_MASK;
        } else if(pair >= MIN_LONG) {
            pair &= LONG_PRIMARY_MASK;  // variable
        }
        // else special mini CE
    } else {
        // two mini CEs, same primary groups, neither expands like above
        uint32_t ce = pair & 0xffff;
        if(ce > variableTop) {
            pair = TWO_SHORT_PRIMARIES_MASK;
        } else {
            U_ASSERT(ce >= MIN_LONG);
            pair &= TWO_LONG_PRIMARIES_MASK;  // variable
        }
    }
    return pair;
}